

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderMatrixTests.cpp
# Opt level: O3

void deqp::gles3::Functional::MatrixCaseUtils::Evaluator<2,_12,_4>::evaluate
               (ShaderEvalContext *evalCtx,InputType in0Type,InputType in1Type)

{
  float *pfVar1;
  Vector<float,_3> *pVVar2;
  int row_2;
  long lVar3;
  undefined4 *puVar4;
  Vector<float,_3> *pVVar5;
  long lVar6;
  long lVar7;
  int col;
  float v;
  float fVar8;
  undefined4 uVar9;
  Vector<float,_3> res;
  Type in1;
  Type in0;
  int aiStack_18 [6];
  
  if (in0Type == INPUTTYPE_DYNAMIC) {
    pfVar1 = (float *)&in0;
    lVar3 = 0;
    lVar6 = 0;
    do {
      lVar7 = 0;
      do {
        uVar9 = 0x3f800000;
        if (lVar3 != lVar7) {
          uVar9 = 0;
        }
        *(undefined4 *)((long)pfVar1 + lVar7) = uVar9;
        lVar7 = lVar7 + 0xc;
      } while (lVar7 != 0x30);
      lVar6 = lVar6 + 1;
      pfVar1 = pfVar1 + 1;
      lVar3 = lVar3 + 0xc;
    } while (lVar6 != 3);
    in0.m_data.m_data[0].m_data._0_8_ = *(undefined8 *)evalCtx->in[0].m_data;
    in0.m_data.m_data[1].m_data[0] = evalCtx->in[1].m_data[0];
    in0.m_data.m_data[0].m_data[2] = evalCtx->in[0].m_data[2];
    in0.m_data.m_data[1].m_data._4_8_ = *(undefined8 *)(evalCtx->in[1].m_data + 1);
    in0.m_data.m_data[2].m_data._0_8_ = *(undefined8 *)evalCtx->in[2].m_data;
    in0.m_data.m_data[3].m_data[0] = evalCtx->in[3].m_data[0];
    in0.m_data.m_data[2].m_data[2] = evalCtx->in[2].m_data[2];
    in0.m_data.m_data[3].m_data._4_8_ = *(undefined8 *)(evalCtx->in[3].m_data + 1);
  }
  else {
    pVVar2 = (Vector<float,_3> *)&in0;
    in0.m_data.m_data[2].m_data[2] = 0.0;
    in0.m_data.m_data[3].m_data[0] = 0.0;
    in0.m_data.m_data[3].m_data[1] = 0.0;
    in0.m_data.m_data[3].m_data[2] = 0.0;
    in0.m_data.m_data[1].m_data[1] = 0.0;
    in0.m_data.m_data[1].m_data[2] = 0.0;
    in0.m_data.m_data[2].m_data[0] = 0.0;
    in0.m_data.m_data[2].m_data[1] = 0.0;
    in0.m_data.m_data[0].m_data[0] = 0.0;
    in0.m_data.m_data[0].m_data[1] = 0.0;
    in0.m_data.m_data[0].m_data[2] = 0.0;
    in0.m_data.m_data[1].m_data[0] = 0.0;
    puVar4 = &s_constInMat4x3;
    lVar3 = 0;
    do {
      lVar6 = 0;
      pVVar5 = pVVar2;
      do {
        ((Vector<tcu::Vector<float,_3>,_4> *)pVVar5->m_data)->m_data[0].m_data[0] =
             (float)puVar4[lVar6];
        lVar6 = lVar6 + 1;
        pVVar5 = pVVar5 + 1;
      } while (lVar6 != 4);
      lVar3 = lVar3 + 1;
      pVVar2 = (Vector<float,_3> *)(pVVar2->m_data + 1);
      puVar4 = puVar4 + 4;
    } while (lVar3 != 3);
  }
  if (in1Type == INPUTTYPE_DYNAMIC) {
    in1.m_data[0] = (evalCtx->coords).m_data[0];
    in1.m_data[1] = (evalCtx->coords).m_data[1];
    in1.m_data[2] = (evalCtx->coords).m_data[2];
    in1.m_data[3] = (evalCtx->coords).m_data[3];
  }
  else {
    in1.m_data[0] = (float)0x3e4ccccd;
    in1.m_data[1] = (float)0xbf800000;
    in1.m_data[2] = (float)0x3f000000;
    in1.m_data[3] = (float)0x3f4ccccd;
  }
  res.m_data[2] = 0.0;
  res.m_data[0] = 0.0;
  res.m_data[1] = 0.0;
  pVVar2 = (Vector<float,_3> *)&in0;
  lVar3 = 0;
  do {
    fVar8 = 0.0;
    lVar6 = 0;
    pVVar5 = pVVar2;
    do {
      fVar8 = fVar8 + ((Vector<tcu::Vector<float,_3>,_4> *)pVVar5->m_data)->m_data[0].m_data[0] *
                      in1.m_data[lVar6];
      lVar6 = lVar6 + 1;
      pVVar5 = pVVar5 + 1;
    } while (lVar6 != 4);
    res.m_data[lVar3] = fVar8;
    lVar3 = lVar3 + 1;
    pVVar2 = (Vector<float,_3> *)(pVVar2->m_data + 1);
  } while (lVar3 != 3);
  aiStack_18[2] = 0;
  aiStack_18[3] = 1;
  aiStack_18[4] = 2;
  lVar3 = 2;
  do {
    (evalCtx->color).m_data[aiStack_18[lVar3]] = res.m_data[lVar3 + -2];
    lVar3 = lVar3 + 1;
  } while (lVar3 != 5);
  return;
}

Assistant:

static void evaluate (ShaderEvalContext& evalCtx, InputType in0Type, InputType in1Type)
	{
		typename TypeTraits<In0DataType>::Type	in0	= (in0Type == INPUTTYPE_DYNAMIC) ? getInputValue<INPUTTYPE_DYNAMIC, In0DataType>(evalCtx, 0)
																				     : getInputValue<INPUTTYPE_CONST,	In0DataType>(evalCtx, 0);
		typename TypeTraits<In1DataType>::Type	in1	= (in1Type == INPUTTYPE_DYNAMIC) ? getInputValue<INPUTTYPE_DYNAMIC, In1DataType>(evalCtx, 1)
																				     : getInputValue<INPUTTYPE_CONST,	In1DataType>(evalCtx, 1);
		evalCtx.color.xyz() = reduceToVec3(in0 * in1);
	}